

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_serializer.hpp
# Opt level: O2

void __thiscall duckdb::BinarySerializer::VarIntEncode<int>(BinarySerializer *this,int value)

{
  idx_t iVar1;
  uint8_t buffer [16];
  data_t local_28 [24];
  
  local_28[0] = '\0';
  local_28[1] = '\0';
  local_28[2] = '\0';
  local_28[3] = '\0';
  local_28[4] = '\0';
  local_28[5] = '\0';
  local_28[6] = '\0';
  local_28[7] = '\0';
  local_28[8] = '\0';
  local_28[9] = '\0';
  local_28[10] = '\0';
  local_28[0xb] = '\0';
  local_28[0xc] = '\0';
  local_28[0xd] = '\0';
  local_28[0xe] = '\0';
  local_28[0xf] = '\0';
  iVar1 = EncodingUtil::EncodeSignedLEB128<int>(local_28,value);
  (**this->stream->_vptr_WriteStream)(this->stream,local_28,iVar1);
  return;
}

Assistant:

void VarIntEncode(T value) {
		uint8_t buffer[16] = {};
		auto write_size = EncodingUtil::EncodeLEB128<T>(buffer, value);
		D_ASSERT(write_size <= sizeof(buffer));
		WriteData(buffer, write_size);
	}